

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O0

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
duckdb::RemoveFieldInfo::Deserialize(Deserializer *deserializer)

{
  Deserializer *pDVar1;
  pointer pRVar2;
  pointer this;
  Deserializer *in_RSI;
  AlterTableInfo *in_RDI;
  unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true> result;
  pointer in_stack_ffffffffffffff88;
  RemoveFieldInfo *in_stack_ffffffffffffff90;
  field_id_t field_id;
  Deserializer *this_00;
  _Head_base<0UL,_duckdb::AlterTableInfo_*,_false> _Var3;
  undefined1 local_18 [8];
  Deserializer *local_10;
  
  _Var3._M_head_impl = in_RDI;
  local_10 = in_RSI;
  pDVar1 = (Deserializer *)operator_new(0x98);
  RemoveFieldInfo(in_stack_ffffffffffffff90);
  field_id = (field_id_t)((ulong)local_18 >> 0x30);
  unique_ptr<duckdb::RemoveFieldInfo,std::default_delete<duckdb::RemoveFieldInfo>,true>::
  unique_ptr<std::default_delete<duckdb::RemoveFieldInfo>,void>
            ((unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>
              *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  this_00 = local_10;
  pRVar2 = unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>
                       *)in_stack_ffffffffffffff90);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (pDVar1,(field_id_t)((ulong)_Var3._M_head_impl >> 0x30),(char *)in_RDI,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)pRVar2);
  pDVar1 = local_10;
  pRVar2 = unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>
                       *)in_stack_ffffffffffffff90);
  Deserializer::ReadPropertyWithDefault<bool>(this_00,field_id,(char *)pRVar2,(bool *)pDVar1);
  this = unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>::
         operator->((unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>
                     *)in_stack_ffffffffffffff90);
  Deserializer::ReadPropertyWithDefault<bool>(this_00,field_id,(char *)pRVar2,(bool *)pDVar1);
  unique_ptr<duckdb::AlterTableInfo,std::default_delete<duckdb::AlterTableInfo>,true>::
  unique_ptr<duckdb::RemoveFieldInfo,std::default_delete<std::unique_ptr<duckdb::AlterTableInfo,std::default_delete<duckdb::AlterTableInfo>>>,void>
            ((unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>
              *)this,(unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>_>
                      *)local_10);
  unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>::
  ~unique_ptr((unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>
               *)0xae3dbc);
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (_Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>)
         _Var3._M_head_impl;
}

Assistant:

unique_ptr<AlterTableInfo> RemoveFieldInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RemoveFieldInfo>(new RemoveFieldInfo());
	deserializer.ReadPropertyWithDefault<vector<string>>(400, "column_path", result->column_path);
	deserializer.ReadPropertyWithDefault<bool>(401, "if_column_exists", result->if_column_exists);
	deserializer.ReadPropertyWithDefault<bool>(402, "cascade", result->cascade);
	return std::move(result);
}